

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::SetNotNull(DuckTableEntry *this,ClientContext *context,SetNotNullInfo *info)

{
  size_type *psVar1;
  __node_base *__ht;
  pointer pCVar2;
  SchemaCatalogEntry *pSVar3;
  pointer puVar4;
  Catalog *pCVar5;
  bool bVar6;
  bool bVar7;
  CreateTableInfo *this_00;
  pointer pCVar8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  ColumnDefinition *this_02;
  reference this_03;
  pointer pCVar9;
  NotNullConstraint *pNVar10;
  Binder *info_00;
  type pBVar11;
  DuckTableEntry *pDVar12;
  PhysicalIndex PVar13;
  type __args_1;
  type __args_2;
  BinderException *this_04;
  long in_RCX;
  size_type __n;
  pointer *__ptr;
  templated_unique_single_t bound_constraint;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  shared_ptr<duckdb::Binder,_true> binder;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_118;
  undefined1 local_109;
  undefined1 local_108 [48];
  undefined1 local_d8 [16];
  undefined1 local_c8 [64];
  __node_base_ptr local_88;
  __buckets_ptr pp_Stack_80;
  pointer local_78;
  bool local_70;
  shared_ptr<duckdb::DataTable,_true> local_60;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_50;
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  ClientContext *local_38;
  
  pSVar3 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  local_108._32_8_ = info;
  this_00 = (CreateTableInfo *)operator_new(0x1d8);
  pCVar2 = (pointer)(local_d8 + 0x10);
  local_d8._0_8_ = pCVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,*(long *)&context->interrupted,
             (long)&(((context->registered_state).
                      super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl)
                    ->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
  CreateTableInfo::CreateTableInfo(this_00,pSVar3,(string *)local_d8);
  local_118._M_head_impl = this_00;
  if ((pointer)local_d8._0_8_ != pCVar2) {
    operator_delete((void *)local_d8._0_8_);
  }
  pCVar8 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_118);
  Value::operator=(&(pCVar8->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar8 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_118);
  __ht = &(context->config).profiler_settings._M_h._M_before_begin;
  this_01 = &(pCVar8->super_CreateInfo).tags;
  if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)__ht != this_01) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_01,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)__ht);
  }
  local_108._40_8_ = &(context->config).asof_loop_join_threshold;
  ColumnList::Copy((ColumnList *)local_d8,(ColumnList *)local_108._40_8_);
  pCVar8 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_118);
  local_38 = (ClientContext *)
             (pCVar8->columns).columns.
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pCVar8->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._0_8_;
  local_48 = (element_type *)
             (pCVar8->columns).columns.
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_start;
  _Stack_40._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (pCVar8->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (pCVar8->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
  (pCVar8->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
  local_d8._0_8_ = (NotNullConstraint *)0x0;
  local_d8._8_8_ = (pointer)0x0;
  local_c8._0_8_ = 0;
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
             &stack0xffffffffffffffb8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(pCVar8->columns).name_map,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_c8 + 8));
  puVar4 = (pCVar8->columns).physical_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pCVar8->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_88;
  (pCVar8->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)pp_Stack_80;
  (pCVar8->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_78;
  local_88 = (__node_base_ptr)0x0;
  pp_Stack_80 = (__buckets_ptr)0x0;
  local_78 = (pointer)0x0;
  if (puVar4 == (pointer)0x0) {
    (pCVar8->columns).allow_duplicate_names = local_70;
  }
  else {
    operator_delete(puVar4);
    (pCVar8->columns).allow_duplicate_names = local_70;
    if (local_88 != (__node_base_ptr)0x0) {
      operator_delete(local_88);
    }
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_c8 + 8));
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)local_d8
            );
  local_108._8_8_ =
       TableCatalogEntry::GetColumnIndex
                 ((TableCatalogEntry *)context,(string *)(in_RCX + 0x78),false);
  this_02 = ColumnList::GetColumn((ColumnList *)local_108._40_8_,(LogicalIndex)local_108._8_8_);
  bVar7 = ColumnDefinition::Generated(this_02);
  if (bVar7) {
    this_04 = (BinderException *)__cxa_allocate_exception(0x10);
    local_d8._0_8_ = pCVar2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"Unsupported constraint for generated column!","");
    BinderException::BinderException(this_04,(string *)local_d8);
    __cxa_throw(this_04,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((context->config).set_variables._M_h._M_single_bucket !=
      (__node_base_ptr)(context->config).set_variables._M_h._M_rehash_policy._M_next_resize) {
    __n = 0;
    bVar7 = false;
    local_50._M_head_impl = (CatalogEntry *)this;
    do {
      this_03 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                              *)&(context->config).set_variables._M_h._M_rehash_policy.
                                 _M_next_resize,__n);
      pCVar9 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_03);
      (*pCVar9->_vptr_Constraint[3])
                ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_d8,pCVar9);
      pCVar9 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                           *)local_d8);
      if (pCVar9->type == NOT_NULL) {
        pCVar9 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                 operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                             *)local_d8);
        pNVar10 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar9);
        bVar7 = (bool)(bVar7 | (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               (pNVar10->index).index ==
                               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      }
      pCVar8 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_118);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar8->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_d8);
      if ((NotNullConstraint *)local_d8._0_8_ != (NotNullConstraint *)0x0) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)((long)(context->config).set_variables._M_h._M_single_bucket -
                                 (context->config).set_variables._M_h._M_rehash_policy.
                                 _M_next_resize) >> 3));
    bVar6 = true;
    this = (DuckTableEntry *)local_50._M_head_impl;
    if (bVar7) goto LAB_01563709;
  }
  pCVar8 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_118);
  pNVar10 = (NotNullConstraint *)operator_new(0x18);
  NotNullConstraint::NotNullConstraint(pNVar10,(LogicalIndex)local_108._8_8_);
  local_d8._0_8_ = pNVar10;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
            ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
              *)&pCVar8->constraints,
             (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
             local_d8);
  if ((NotNullConstraint *)local_d8._0_8_ != (NotNullConstraint *)0x0) {
    (**(code **)(*(long *)local_d8._0_8_ + 8))();
  }
  bVar6 = false;
LAB_01563709:
  Binder::CreateBinder
            ((Binder *)&stack0xffffffffffffffb8,(ClientContext *)local_108._32_8_,
             (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)&stack0xffffffffffffffb8);
  local_108._16_8_ = local_118._M_head_impl;
  local_118._M_head_impl = (CreateTableInfo *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_108,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             info_00,(SchemaCatalogEntry *)(local_108 + 0x10));
  if ((ClientContext *)local_108._16_8_ != (ClientContext *)0x0) {
    (*(((CreateInfo *)local_108._16_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_108._16_8_ = (ClientContext *)0x0;
  if (bVar6) {
    pCVar5 = (Catalog *)(context->config).max_expression_depth;
    pSVar3 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    pBVar11 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)local_108);
    pDVar12 = (DuckTableEntry *)operator_new(0x298);
    local_d8._0_8_ = (context->config).user_variables._M_h._M_bucket_count;
    local_d8._8_8_ = (context->config).user_variables._M_h._M_before_begin._M_nxt;
    if ((pointer)local_d8._8_8_ != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(((pointer)local_d8._8_8_)->name)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(((pointer)local_d8._8_8_)->name)._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
    DuckTableEntry(pDVar12,pCVar5,pSVar3,pBVar11,(shared_ptr<duckdb::DataTable,_true> *)local_d8);
    if ((pointer)local_d8._8_8_ != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    *(DuckTableEntry **)this = pDVar12;
  }
  else {
    PVar13 = ColumnList::LogicalToPhysical
                       ((ColumnList *)local_108._40_8_,(LogicalIndex)local_108._8_8_);
    local_108._24_8_ = operator_new(0x18);
    *(undefined1 *)(local_108._24_8_ + 8) = 1;
    *(undefined ***)local_108._24_8_ = &PTR__BoundConstraint_0244c368;
    *(idx_t *)(local_108._24_8_ + 0x10) = PVar13.index;
    __args_1 = shared_ptr<duckdb::DataTable,_true>::operator*
                         ((shared_ptr<duckdb::DataTable,_true> *)
                          &(context->config).user_variables._M_h._M_bucket_count);
    __args_2 = unique_ptr<duckdb::BoundNotNullConstraint,_std::default_delete<duckdb::BoundNotNullConstraint>,_true>
               ::operator*((unique_ptr<duckdb::BoundNotNullConstraint,_std::default_delete<duckdb::BoundNotNullConstraint>,_true>
                            *)(local_108 + 0x18));
    local_d8._0_8_ = (pointer)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::DataTable,std::allocator<duckdb::DataTable>,duckdb::ClientContext&,duckdb::DataTable&,duckdb::BoundNotNullConstraint&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8),(DataTable **)local_d8,
               (allocator<duckdb::DataTable> *)&local_109,(ClientContext *)local_108._32_8_,__args_1
               ,__args_2);
    shared_ptr<duckdb::DataTable,_true>::shared_ptr
              (&local_60,(shared_ptr<duckdb::DataTable> *)local_d8);
    if ((pointer)local_d8._8_8_ != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    pCVar5 = (Catalog *)(context->config).max_expression_depth;
    pSVar3 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    pBVar11 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)local_108);
    pDVar12 = (DuckTableEntry *)operator_new(0x298);
    local_d8._0_8_ =
         local_60.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d8._8_8_ =
         local_60.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((pointer)local_60.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (int)*(size_type *)
                   &(local_60.internal.
                     super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (int)*(size_type *)
                   &(local_60.internal.
                     super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi)->_M_use_count + 1;
      }
    }
    DuckTableEntry(pDVar12,pCVar5,pSVar3,pBVar11,(shared_ptr<duckdb::DataTable,_true> *)local_d8);
    if ((pointer)local_d8._8_8_ != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
    }
    *(DuckTableEntry **)this = pDVar12;
    if ((pointer)local_60.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi != (pointer)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.internal.super___shared_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((__buckets_ptr)local_108._24_8_ != (__buckets_ptr)0x0) {
      (*(code *)(*(__node_base_ptr *)local_108._24_8_)[1]._M_nxt)();
    }
  }
  if ((element_type *)local_108._0_8_ != (element_type *)0x0) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)local_108,
               (BoundCreateTableInfo *)local_108._0_8_);
  }
  if ((pointer)_Stack_40._M_pi != (pointer)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  if (local_118._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_118._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (_Tuple_impl<0UL,_duckdb::CatalogEntry_*,_std::default_delete<duckdb::CatalogEntry>_>)this;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::SetNotNull(ClientContext &context, SetNotNullInfo &info) {
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->comment = comment;
	create_info->tags = tags;
	create_info->columns = columns.Copy();

	auto not_null_idx = GetColumnIndex(info.column_name);
	if (columns.GetColumn(LogicalIndex(not_null_idx)).Generated()) {
		throw BinderException("Unsupported constraint for generated column!");
	}
	bool has_not_null = false;
	for (idx_t i = 0; i < constraints.size(); i++) {
		auto constraint = constraints[i]->Copy();
		if (constraint->type == ConstraintType::NOT_NULL) {
			auto &not_null = constraint->Cast<NotNullConstraint>();
			if (not_null.index == not_null_idx) {
				has_not_null = true;
			}
		}
		create_info->constraints.push_back(std::move(constraint));
	}
	if (!has_not_null) {
		create_info->constraints.push_back(make_uniq<NotNullConstraint>(not_null_idx));
	}
	auto binder = Binder::CreateBinder(context);
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);

	// Early return
	if (has_not_null) {
		return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
	}

	// Return with new storage info. Note that we need the bound column index here.
	auto physical_columns = columns.LogicalToPhysical(LogicalIndex(not_null_idx));
	auto bound_constraint = make_uniq<BoundNotNullConstraint>(physical_columns);
	auto new_storage = make_shared_ptr<DataTable>(context, *storage, *bound_constraint);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
}